

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

set<interfaces::WalletTx,_std::less<interfaces::WalletTx>,_std::allocator<interfaces::WalletTx>_> *
__thiscall
wallet::anon_unknown_5::WalletImpl::getWalletTxs
          (set<interfaces::WalletTx,_std::less<interfaces::WalletTx>,_std::allocator<interfaces::WalletTx>_>
           *__return_storage_ptr__,WalletImpl *this)

{
  _Rb_tree_header *p_Var1;
  __node_base *p_Var2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock22;
  unique_lock<std::recursive_mutex> uStack_128;
  WalletTx local_118;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_128,
             &((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->cs_wallet,"m_wallet->cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/interfaces.cpp"
             ,0x15f,false);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->mapWallet)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    MakeWalletTx(&local_118,
                 (this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(CWalletTx *)(p_Var2 + 5));
    _GLOBAL__N_1::std::
    _Rb_tree<interfaces::WalletTx,_interfaces::WalletTx,_std::_Identity<interfaces::WalletTx>,_std::less<interfaces::WalletTx>,_std::allocator<interfaces::WalletTx>_>
    ::_M_emplace_unique<interfaces::WalletTx>(&__return_storage_ptr__->_M_t,&local_118);
    interfaces::WalletTx::~WalletTx(&local_118);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_128);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::set<WalletTx> getWalletTxs() override
    {
        LOCK(m_wallet->cs_wallet);
        std::set<WalletTx> result;
        for (const auto& entry : m_wallet->mapWallet) {
            result.emplace(MakeWalletTx(*m_wallet, entry.second));
        }
        return result;
    }